

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  char *fn;
  size_t sVar2;
  bool bVar3;
  mtree_entry_conflict *me;
  archive_string *dest;
  mode_t mVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  la_int64_t lVar8;
  archive_entry *entry_00;
  time_t t;
  mtree_entry_conflict *pmVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar10;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *__s2;
  long lVar11;
  mtree_entry_conflict *mtree_entry;
  mtree_entry_conflict *file;
  char name [256];
  mtree_entry_conflict *local_190;
  mtree_entry_conflict *local_188;
  int local_17c;
  archive_string local_178;
  archive_string *local_158;
  undefined8 *local_150;
  char *local_148;
  mtree_entry_conflict *local_140;
  char local_138 [264];
  
  puVar1 = (undefined8 *)a->format_data;
  if (*(int *)(puVar1 + 0xe) != 0) {
    *(undefined4 *)(puVar1 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar1 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar1 + 0x24) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar1 + 300) = 0;
    }
  }
  lVar8 = archive_entry_size(entry);
  puVar1[0xf] = lVar8;
  if ((*(int *)((long)puVar1 + 0x124) != 0) &&
     (mVar4 = archive_entry_filetype(entry), mVar4 != 0x4000)) {
    return 0;
  }
  iVar5 = mtree_entry_new(a,entry,&local_188);
  me = local_188;
  if (iVar5 < -0x14) {
    return iVar5;
  }
  fn = (char *)a->format_data;
  sVar2 = (local_188->parentdir).length;
  local_150 = puVar1;
  if (sVar2 == 0) {
    if (((local_188->basename).length != 1) || (*(local_188->basename).s != '.')) {
      archive_set_error(&a->archive,-1,
                        "Internal programing error in generating canonical name for %s",
                        (local_188->pathname).s);
LAB_004b4aa1:
      iVar6 = -0x19;
      goto LAB_004b4f88;
    }
    local_188->parent = local_188;
    pmVar9 = *(mtree_entry_conflict **)(fn + 8);
    if (pmVar9 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(fn + 8) = local_188;
      local_188->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(fn + 0x38) = local_188;
      *(mtree_entry_conflict ***)(fn + 0x38) = &local_188->next;
      goto LAB_004b4db4;
    }
  }
  else {
    __s2 = (local_188->parentdir).s;
    pcVar10 = extraout_RDX;
    if ((*(size_t *)(fn + 0x20) == sVar2) &&
       (iVar6 = strcmp(((archive_string *)(fn + 0x18))->s,__s2), pcVar10 = extraout_RDX_00,
       iVar6 == 0)) {
      iVar6 = __archive_rb_tree_insert_node
                        (*(archive_rb_tree **)(*(long *)(fn + 0x10) + 0x28),&me->rbnode);
      local_190 = *(mtree_entry_conflict **)(fn + 0x10);
joined_r0x004b4ceb:
      if (iVar6 != 0) {
        me->parent = local_190;
        me->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(fn + 0x38) = me;
        *(mtree_entry_conflict ***)(fn + 0x38) = &me->next;
LAB_004b4db4:
        iVar6 = 0;
        goto LAB_004b4f88;
      }
      pmVar9 = (mtree_entry_conflict *)
               __archive_rb_tree_find_node(&local_190->dir_info->rbtree,(me->basename).s);
    }
    else {
      local_190 = *(mtree_entry_conflict **)(fn + 8);
      local_158 = (archive_string *)(fn + 0x18);
      uVar7 = get_path_component(local_138,(size_t)__s2,pcVar10);
      local_148 = __s2;
      if (uVar7 == 0) {
        pmVar9 = (mtree_entry_conflict *)0x0;
      }
      else {
        pcVar10 = extraout_RDX_01;
        do {
          while( true ) {
            if ((int)uVar7 < 0) {
              archive_set_error(&a->archive,-1,"A name buffer is too small");
              iVar6 = -0x1e;
              goto LAB_004b4f88;
            }
            if ((((uVar7 != 1) || (local_138[0] != '.')) ||
                (local_190 == (mtree_entry_conflict *)0x0)) ||
               (local_190 != *(mtree_entry_conflict **)(fn + 8))) break;
            if (__s2[1] == '/') {
              __s2 = __s2 + 2;
            }
            else {
              __s2 = __s2 + 1;
            }
            uVar7 = get_path_component(local_138,(size_t)__s2,pcVar10);
            pcVar10 = extraout_RDX_02;
            if (uVar7 == 0) goto LAB_004b4a2c;
          }
          if (local_190 == (mtree_entry_conflict *)0x0) {
            pmVar9 = (mtree_entry_conflict *)0x0;
          }
          else {
            pmVar9 = (mtree_entry_conflict *)
                     __archive_rb_tree_find_node(&local_190->dir_info->rbtree,local_138);
            pcVar10 = extraout_RDX_03;
          }
          if (pmVar9 == (mtree_entry_conflict *)0x0) break;
          if (*__s2 == '\0') goto LAB_004b4ab6;
          if (pmVar9->dir_info == (dir_info *)0x0) {
            archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                              (pmVar9->pathname).s,(me->pathname).s);
            goto LAB_004b4aa1;
          }
          __s2 = __s2 + (ulong)(__s2[uVar7] == '/') + (ulong)uVar7;
          uVar7 = get_path_component(local_138,(size_t)__s2,pcVar10);
          pcVar10 = extraout_RDX_04;
          local_190 = pmVar9;
        } while (uVar7 != 0);
LAB_004b4a2c:
        pmVar9 = (mtree_entry_conflict *)0x0;
      }
LAB_004b4ab6:
      if (pmVar9 == (mtree_entry_conflict *)0x0) {
        do {
          dest = local_158;
          if (*__s2 == '\0') {
            *(mtree_entry_conflict **)(fn + 0x10) = local_190;
            fn[0x20] = '\0';
            fn[0x21] = '\0';
            fn[0x22] = '\0';
            fn[0x23] = '\0';
            fn[0x24] = '\0';
            fn[0x25] = '\0';
            fn[0x26] = '\0';
            fn[0x27] = '\0';
            archive_string_ensure
                      (local_158,(local_190->parentdir).length + (local_190->basename).length + 2);
            sVar2 = (local_190->parentdir).length;
            if ((local_190->basename).length + sVar2 == 0) {
              *dest->s = '\0';
            }
            else {
              if (sVar2 != 0) {
                fn[0x20] = '\0';
                fn[0x21] = '\0';
                fn[0x22] = '\0';
                fn[0x23] = '\0';
                fn[0x24] = '\0';
                fn[0x25] = '\0';
                fn[0x26] = '\0';
                fn[0x27] = '\0';
                archive_string_concat(dest,&local_190->parentdir);
                archive_strappend_char(dest,'/');
              }
              archive_string_concat(dest,&local_190->basename);
            }
            iVar6 = __archive_rb_tree_insert_node(&local_190->dir_info->rbtree,&me->rbnode);
            goto joined_r0x004b4ceb;
          }
          lVar11 = (long)(int)uVar7;
          local_178.s = (char *)0x0;
          local_178.length = 0;
          local_178.buffer_length = 0;
          archive_strncat(&local_178,local_148,(size_t)(__s2 + (lVar11 - (long)local_148)));
          pcVar10 = local_178.s;
          if (local_178.s[local_178.length - 1] == '/') {
            local_178.s[local_178.length - 1] = '\0';
            local_178.length = local_178.length - 1;
          }
          entry_00 = archive_entry_new();
          if (entry_00 == (archive_entry *)0x0) {
LAB_004b4b79:
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
            iVar6 = -0x1e;
            bVar3 = true;
            pmVar9 = (mtree_entry_conflict *)0x0;
          }
          else {
            archive_entry_copy_pathname(entry_00,pcVar10);
            archive_entry_set_mode(entry_00,0x41ed);
            t = time((time_t *)0x0);
            archive_entry_set_mtime(entry_00,t,0);
            iVar6 = mtree_entry_new(a,entry_00,&local_140);
            archive_entry_free(entry_00);
            if (iVar6 < -0x14) goto LAB_004b4b79;
            local_140->dir_info->virtual = 1;
            bVar3 = false;
            iVar6 = 0;
            pmVar9 = local_140;
          }
          archive_string_free(&local_178);
          if (bVar3) {
            bVar3 = false;
          }
          else {
            iVar6 = strcmp((pmVar9->pathname).s,".");
            if (iVar6 == 0) {
              pmVar9->parent = pmVar9;
              *(mtree_entry_conflict **)(fn + 8) = pmVar9;
            }
            else {
              __archive_rb_tree_insert_node(&local_190->dir_info->rbtree,&pmVar9->rbnode);
              pmVar9->parent = local_190;
            }
            pmVar9->next = (mtree_entry_conflict *)0x0;
            **(undefined8 **)(fn + 0x38) = pmVar9;
            *(mtree_entry_conflict ***)(fn + 0x38) = &pmVar9->next;
            __s2 = __s2 + (ulong)(__s2[lVar11] == '/') + lVar11;
            uVar7 = get_path_component(local_138,(size_t)__s2,fn);
            if ((int)uVar7 < 0) {
              archive_string_free(&local_178);
              bVar3 = false;
              uVar7 = 0xffffffff;
              archive_set_error(&a->archive,-1,"A name buffer is too small");
              iVar6 = -0x1e;
            }
            else {
              bVar3 = true;
              iVar6 = local_17c;
              local_190 = pmVar9;
            }
          }
          local_17c = iVar6;
        } while (bVar3);
        goto LAB_004b4f88;
      }
    }
  }
  uVar7 = me->mode ^ pmVar9->mode;
  if ((uVar7 & 0xf000) == 0) {
    (pmVar9->symlink).length = 0;
    archive_string_concat(&pmVar9->symlink,&me->symlink);
    (pmVar9->uname).length = 0;
    archive_string_concat(&pmVar9->uname,&me->uname);
    (pmVar9->gname).length = 0;
    archive_string_concat(&pmVar9->gname,&me->gname);
    (pmVar9->fflags_text).length = 0;
    archive_string_concat(&pmVar9->fflags_text,&me->fflags_text);
    pmVar9->nlink = me->nlink;
    pmVar9->filetype = me->filetype;
    pmVar9->mode = me->mode;
    pmVar9->size = me->size;
    pmVar9->uid = me->uid;
    pmVar9->gid = me->gid;
    pmVar9->fflags_set = me->fflags_set;
    pmVar9->fflags_clear = me->fflags_clear;
    pmVar9->mtime = me->mtime;
    pmVar9->mtime_nsec = me->mtime_nsec;
    pmVar9->rdevmajor = me->rdevmajor;
    pmVar9->rdevminor = me->rdevminor;
    pmVar9->devmajor = me->devmajor;
    pmVar9->devminor = me->devminor;
    pmVar9->ino = me->ino;
    iVar6 = -0x14;
  }
  else {
    archive_set_error(&a->archive,-1,"Found duplicate entries `%s\' and its file type is different",
                      (pmVar9->pathname).s);
    iVar6 = -0x19;
  }
  if ((uVar7 & 0xf000) == 0) {
    if (pmVar9->dir_info != (dir_info *)0x0) {
      pmVar9->dir_info->virtual = 0;
    }
    local_188 = pmVar9;
    mtree_entry_free(me);
    iVar6 = -0x14;
  }
LAB_004b4f88:
  puVar1 = local_150;
  if (iVar6 < -0x14) {
    mtree_entry_free(local_188);
    iVar5 = iVar6;
  }
  else {
    *local_150 = local_188;
    if (local_188->reg_info != (reg_info *)0x0) {
      *(undefined4 *)(local_150 + 0x1c) = 0;
      if ((*(uint *)(local_150 + 0x24) & 1) != 0) {
        local_150[0x1c] = 1;
        local_150[0x1d] = 0;
      }
      if ((*(uint *)(local_150 + 0x24) >> 8 & 1) != 0) {
        iVar6 = __archive_openssl_md5init((archive_md5_ctx *)(local_150 + 0x1e));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 1;
        }
        else {
          *(byte *)((long)puVar1 + 0x121) = *(byte *)((long)puVar1 + 0x121) & 0xfe;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x121) & 0x20) != 0) {
        iVar6 = __archive_openssl_ripemd160init((archive_rmd160_ctx *)(puVar1 + 0x1f));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x20;
        }
        else {
          *(byte *)((long)puVar1 + 0x121) = *(byte *)((long)puVar1 + 0x121) & 0xdf;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x121) & 0x40) != 0) {
        iVar6 = __archive_openssl_sha1init((archive_sha1_ctx *)(puVar1 + 0x20));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe1) = *(byte *)((long)puVar1 + 0xe1) | 0x40;
        }
        else {
          *(byte *)((long)puVar1 + 0x121) = *(byte *)((long)puVar1 + 0x121) & 0xbf;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x122) & 0x80) != 0) {
        iVar6 = __archive_openssl_sha256init((archive_sha256_ctx *)(puVar1 + 0x21));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe2) = *(byte *)((long)puVar1 + 0xe2) | 0x80;
        }
        else {
          *(byte *)((long)puVar1 + 0x122) = *(byte *)((long)puVar1 + 0x122) & 0x7f;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x123) & 1) != 0) {
        iVar6 = __archive_openssl_sha384init((archive_sha384_ctx *)(puVar1 + 0x22));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 1;
        }
        else {
          *(byte *)((long)puVar1 + 0x123) = *(byte *)((long)puVar1 + 0x123) & 0xfe;
        }
      }
      if ((*(byte *)((long)puVar1 + 0x123) & 2) != 0) {
        iVar6 = __archive_openssl_sha512init((archive_sha512_ctx *)(puVar1 + 0x23));
        if (iVar6 == 0) {
          *(byte *)((long)puVar1 + 0xe3) = *(byte *)((long)puVar1 + 0xe3) | 2;
        }
        else {
          *(byte *)((long)puVar1 + 0x123) = *(byte *)((long)puVar1 + 0x123) & 0xfd;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}